

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.cpp
# Opt level: O2

pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> * __thiscall
embree::sse2::GridSOA::buildMBlurBVH
          (pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> *__return_storage_ptr__,
          GridSOA *this,size_t time,GridRange *range,size_t *allocator)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  size_t i;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint *puVar12;
  uint v_size_1;
  uint u_size;
  uint uVar13;
  uint uVar14;
  uint v_size;
  uint uVar15;
  ulong uVar16;
  GridRange *range_00;
  float fVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  GridRange local_128;
  uint local_118 [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  char *local_a0;
  undefined1 local_98 [16];
  pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> node_bounds;
  
  uVar7 = range->u_start;
  uVar1 = range->u_end;
  if ((uVar1 - uVar7) + 1 < 4) {
    uVar6 = range->v_end;
    uVar10 = range->v_start;
    uVar16 = (ulong)uVar10;
    if ((uVar6 - uVar10) + 1 < 4) {
      uVar13 = this->width;
      uVar15 = this->dim_offset;
      lVar5 = uVar16 * uVar13;
      lVar4 = this->gridBytes * time + (ulong)this->gridOffset + 0x30;
      iVar9 = uVar10 * uVar13;
      aVar18 = _DAT_01f45a40;
      aVar19 = _DAT_01f45a30;
      for (uVar14 = uVar10; uVar3 = uVar7, uVar14 <= uVar6; uVar14 = uVar14 + 1) {
        for (; uVar3 <= uVar1; uVar3 = uVar3 + 1) {
          uVar8 = (ulong)(uVar3 + iVar9);
          auVar20._4_4_ =
               *(undefined4 *)(this->data + uVar8 * 4 + (ulong)uVar15 * 4 + lVar4 + -0x30);
          auVar20._0_4_ = *(undefined4 *)(this->data + uVar8 * 4 + lVar4 + -0x30);
          auVar20._8_4_ =
               *(undefined4 *)(this->data + uVar8 * 4 + (ulong)(uVar15 * 2) * 4 + lVar4 + -0x30);
          auVar20._12_4_ = 0;
          aVar19.m128 = (__m128)minps(aVar19.m128,auVar20);
          aVar18.m128 = (__m128)maxps(aVar18.m128,auVar20);
        }
        iVar9 = iVar9 + uVar13;
      }
      lVar4 = (time + 1) * (ulong)this->gridBytes + (ulong)this->gridOffset + 0x30;
      iVar9 = uVar10 * uVar13;
      aVar21 = _DAT_01f45a40;
      aVar23 = _DAT_01f45a30;
      for (; uVar10 = uVar7, (uint)uVar16 <= uVar6; uVar16 = (ulong)((uint)uVar16 + 1)) {
        for (; uVar10 <= uVar1; uVar10 = uVar10 + 1) {
          uVar8 = (ulong)(iVar9 + uVar10);
          auVar22._4_4_ =
               *(undefined4 *)(this->data + uVar8 * 4 + (ulong)uVar15 * 4 + lVar4 + -0x30);
          auVar22._0_4_ = *(undefined4 *)(this->data + uVar8 * 4 + lVar4 + -0x30);
          auVar22._8_4_ =
               *(undefined4 *)(this->data + uVar8 * 4 + (ulong)(uVar15 * 2) * 4 + lVar4 + -0x30);
          auVar22._12_4_ = 0;
          aVar23.m128 = (__m128)minps(aVar23.m128,auVar22);
          aVar21.m128 = (__m128)maxps(aVar21.m128,auVar22);
        }
        iVar9 = iVar9 + uVar13;
      }
      (__return_storage_ptr__->first).ptr = (lVar5 + (ulong)uVar7) * 0x10 + 0x18;
      (__return_storage_ptr__->second).bounds0.lower.field_0 = aVar19;
      (__return_storage_ptr__->second).bounds0.upper.field_0 = aVar18;
      (__return_storage_ptr__->second).bounds1.lower.field_0 = aVar23;
      (__return_storage_ptr__->second).bounds1.upper.field_0 = aVar21;
      return __return_storage_ptr__;
    }
  }
  sVar2 = *allocator;
  local_a0 = this->data + sVar2;
  *allocator = sVar2 + 0xe0;
  local_b8 = _DAT_01f45a30;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar2 - 0x10)) = _DAT_01f45a30;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar2 - 0x30)) = local_b8;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[1].data + (sVar2 - 0x18)) = local_b8;
  local_d8 = _DAT_01f45a40;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + sVar2) = _DAT_01f45a40;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar2 - 0x20)) = local_d8;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[1].data + (sVar2 - 8)) = local_d8;
  *(undefined8 *)(this[3].data + (sVar2 - 0x28)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 0x20)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 0x18)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 0x10)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 8)) = 0;
  *(undefined8 *)(this[3].data + sVar2) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x30)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x28)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x20)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x18)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x10)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 8)) = 0;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    *(undefined8 *)(local_a0 + lVar4 * 8) = 8;
  }
  local_128.u_start = range->u_start;
  uVar7 = range->u_end;
  uVar1 = range->v_end;
  local_128.v_start = range->v_start;
  if ((uVar7 - local_128.u_start) + 1 < (uVar1 - local_128.v_start) + 1) {
    uVar6 = local_128.v_start + uVar1 >> 1;
    uVar10 = local_128.u_start;
    local_128.u_end = uVar7;
    local_128.v_end = uVar6;
  }
  else {
    uVar10 = local_128.u_start + uVar7 >> 1;
    uVar6 = local_128.v_start;
    local_128.u_end = uVar10;
    local_128.v_end = uVar1;
  }
  uVar13 = (local_128.u_end - local_128.u_start) + 1;
  uVar15 = (local_128.v_end - local_128.v_start) + 1;
  if ((uVar15 | uVar13) < 4) {
    iVar9 = 1;
  }
  else {
    iVar9 = 2;
    local_118[1] = local_128.u_end;
    local_118[3] = local_128.v_end;
    if (uVar13 < uVar15) {
      local_118[2] = local_128.v_end + local_128.v_start >> 1;
      local_128.v_end = local_118[2];
      local_118[0] = local_128.u_start;
    }
    else {
      local_128.u_end = local_128.u_end + local_128.u_start >> 1;
      local_118[0] = local_128.u_end;
      local_118[2] = local_128.v_start;
    }
  }
  uVar13 = (uVar7 - uVar10) + 1;
  uVar15 = (uVar1 - uVar6) + 1;
  uVar16 = (ulong)(uint)(iVar9 << 4);
  puVar12 = (uint *)((long)&local_128.u_start + uVar16);
  if ((uVar15 | uVar13) < 4) {
    iVar11 = 1;
    *puVar12 = uVar10;
    *(uint *)((long)local_118 + (uVar16 - 0xc)) = uVar7;
    *(uint *)((long)local_118 + (uVar16 - 8)) = uVar6;
    *(uint *)((long)local_118 + (uVar16 - 4)) = uVar1;
  }
  else {
    *puVar12 = uVar10;
    *(uint *)((long)local_118 + (uVar16 - 0xc)) = uVar7;
    *(uint *)((long)local_118 + (uVar16 - 8)) = uVar6;
    *(uint *)((long)local_118 + (uVar16 - 4)) = uVar1;
    *(uint *)((long)local_118 + uVar16) = uVar10;
    *(uint *)((long)local_118 + uVar16 + 4) = uVar7;
    *(uint *)((long)local_118 + uVar16 + 8) = uVar6;
    *(uint *)((long)local_118 + uVar16 + 0xc) = uVar1;
    if (uVar13 < uVar15) {
      uVar7 = uVar6 + uVar1 >> 1;
      *(uint *)((long)local_118 + (uVar16 - 4)) = uVar7;
      *(uint *)((long)local_118 + uVar16 + 8) = uVar7;
    }
    else {
      uVar7 = uVar10 + uVar7 >> 1;
      *(uint *)((long)local_118 + (uVar16 - 0xc)) = uVar7;
      *(uint *)((long)local_118 + uVar16) = uVar7;
    }
    iVar11 = 2;
  }
  range_00 = &local_128;
  local_c8 = local_d8;
  local_e8 = local_b8;
  for (uVar16 = 0; (uint)(iVar9 + iVar11) != uVar16; uVar16 = uVar16 + 1) {
    fVar17 = (float)(this->time_steps - 1);
    local_98 = ZEXT416((uint)((float)time / fVar17));
    buildMBlurBVH(&node_bounds,this,time,range_00,allocator);
    *(size_t *)(this->data + uVar16 * 8 + sVar2) = node_bounds.first.ptr;
    fVar24 = 1.0 / ((float)(time + 1) / fVar17 - (float)local_98._0_4_);
    fVar32 = -(float)local_98._0_4_ * fVar24;
    fVar17 = 1.0 - fVar32;
    auVar26._0_4_ =
         node_bounds.second.bounds0.lower.field_0._0_4_ * fVar17 +
         node_bounds.second.bounds1.lower.field_0._0_4_ * fVar32;
    auVar26._4_4_ =
         node_bounds.second.bounds0.lower.field_0._4_4_ * fVar17 +
         node_bounds.second.bounds1.lower.field_0._4_4_ * fVar32;
    auVar26._8_4_ =
         node_bounds.second.bounds0.lower.field_0._8_4_ * fVar17 +
         node_bounds.second.bounds1.lower.field_0._8_4_ * fVar32;
    auVar26._12_4_ =
         node_bounds.second.bounds0.lower.field_0._12_4_ * fVar17 +
         node_bounds.second.bounds1.lower.field_0._12_4_ * fVar32;
    auVar28._0_4_ =
         fVar17 * node_bounds.second.bounds0.upper.field_0._0_4_ +
         fVar32 * node_bounds.second.bounds1.upper.field_0._0_4_;
    auVar28._4_4_ =
         fVar17 * node_bounds.second.bounds0.upper.field_0._4_4_ +
         fVar32 * node_bounds.second.bounds1.upper.field_0._4_4_;
    auVar28._8_4_ =
         fVar17 * node_bounds.second.bounds0.upper.field_0._8_4_ +
         fVar32 * node_bounds.second.bounds1.upper.field_0._8_4_;
    auVar28._12_4_ =
         fVar17 * node_bounds.second.bounds0.upper.field_0._12_4_ +
         fVar32 * node_bounds.second.bounds1.upper.field_0._12_4_;
    local_b8.m128 = (__m128)minps(local_b8.m128,node_bounds.second.bounds1.lower.field_0);
    local_e8.m128 = (__m128)minps(local_e8.m128,node_bounds.second.bounds0.lower.field_0);
    fVar24 = (1.0 - (float)local_98._0_4_) * fVar24;
    fVar17 = 1.0 - fVar24;
    auVar27._0_4_ =
         node_bounds.second.bounds0.lower.field_0._0_4_ * fVar17 +
         node_bounds.second.bounds1.lower.field_0._0_4_ * fVar24;
    auVar27._4_4_ =
         node_bounds.second.bounds0.lower.field_0._4_4_ * fVar17 +
         node_bounds.second.bounds1.lower.field_0._4_4_ * fVar24;
    auVar27._8_4_ =
         node_bounds.second.bounds0.lower.field_0._8_4_ * fVar17 +
         node_bounds.second.bounds1.lower.field_0._8_4_ * fVar24;
    auVar27._12_4_ =
         node_bounds.second.bounds0.lower.field_0._12_4_ * fVar17 +
         node_bounds.second.bounds1.lower.field_0._12_4_ * fVar24;
    auVar25._0_4_ =
         fVar17 * node_bounds.second.bounds0.upper.field_0._0_4_ +
         fVar24 * node_bounds.second.bounds1.upper.field_0._0_4_;
    auVar25._4_4_ =
         fVar17 * node_bounds.second.bounds0.upper.field_0._4_4_ +
         fVar24 * node_bounds.second.bounds1.upper.field_0._4_4_;
    auVar25._8_4_ =
         fVar17 * node_bounds.second.bounds0.upper.field_0._8_4_ +
         fVar24 * node_bounds.second.bounds1.upper.field_0._8_4_;
    auVar25._12_4_ =
         fVar17 * node_bounds.second.bounds0.upper.field_0._12_4_ +
         fVar24 * node_bounds.second.bounds1.upper.field_0._12_4_;
    auVar20 = minps(auVar26,_DAT_01f4b860);
    auVar22 = maxps(auVar28,_DAT_01f4b850);
    auVar28 = minps(auVar27,_DAT_01f4b860);
    auVar26 = maxps(auVar25,_DAT_01f4b850);
    fVar17 = auVar20._0_4_ - ABS(auVar20._0_4_) * 4.7683716e-07;
    fVar24 = auVar20._4_4_ - ABS(auVar20._4_4_) * 4.7683716e-07;
    fVar32 = auVar20._8_4_ - ABS(auVar20._8_4_) * 4.7683716e-07;
    fVar29 = ABS(auVar22._0_4_) * 4.7683716e-07 + auVar22._0_4_;
    fVar30 = ABS(auVar22._4_4_) * 4.7683716e-07 + auVar22._4_4_;
    fVar31 = ABS(auVar22._8_4_) * 4.7683716e-07 + auVar22._8_4_;
    *(float *)(this[1].data + uVar16 * 4 + sVar2 + -0x18) = fVar17;
    *(float *)(this[2].data + uVar16 * 4 + sVar2 + -0x30) = fVar24;
    *(float *)(this[2].data + uVar16 * 4 + sVar2 + -0x10) = fVar32;
    *(float *)(this[1].data + uVar16 * 4 + sVar2 + -8) = fVar29;
    *(float *)(this[2].data + uVar16 * 4 + sVar2 + -0x20) = fVar30;
    *(float *)(this[2].data + uVar16 * 4 + sVar2) = fVar31;
    *(float *)(this[3].data + uVar16 * 4 + sVar2 + -0x28) =
         (auVar28._0_4_ - ABS(auVar28._0_4_) * 4.7683716e-07) - fVar17;
    *(float *)(this[3].data + uVar16 * 4 + sVar2 + -8) =
         (auVar28._4_4_ - ABS(auVar28._4_4_) * 4.7683716e-07) - fVar24;
    *(float *)(this[4].data + uVar16 * 4 + sVar2 + -0x20) =
         (auVar28._8_4_ - ABS(auVar28._8_4_) * 4.7683716e-07) - fVar32;
    *(float *)(this[3].data + uVar16 * 4 + sVar2 + -0x18) =
         (ABS(auVar26._0_4_) * 4.7683716e-07 + auVar26._0_4_) - fVar29;
    *(float *)(this[4].data + uVar16 * 4 + sVar2 + -0x30) =
         (ABS(auVar26._4_4_) * 4.7683716e-07 + auVar26._4_4_) - fVar30;
    *(float *)(this[4].data + uVar16 * 4 + sVar2 + -0x10) =
         (ABS(auVar26._8_4_) * 4.7683716e-07 + auVar26._8_4_) - fVar31;
    local_c8.m128 = (__m128)maxps(local_c8.m128,node_bounds.second.bounds0.upper.field_0);
    local_d8.m128 = (__m128)maxps(local_d8.m128,node_bounds.second.bounds1.upper.field_0);
    range_00 = range_00 + 1;
  }
  (__return_storage_ptr__->first).ptr = (ulong)local_a0 | 1;
  (__return_storage_ptr__->second).bounds0.lower.field_0 = local_e8;
  (__return_storage_ptr__->second).bounds0.upper.field_0 = local_c8;
  (__return_storage_ptr__->second).bounds1.lower.field_0 = local_b8;
  (__return_storage_ptr__->second).bounds1.upper.field_0 = local_d8;
  return __return_storage_ptr__;
}

Assistant:

std::pair<BVH4::NodeRef,LBBox3fa> GridSOA::buildMBlurBVH(size_t time, const GridRange& range, size_t& allocator)
    {
      /*! create leaf node */
      if (unlikely(range.hasLeafSize()))
      {
        /* we store index of first subgrid vertex as leaf node */
        BVH4::NodeRef curNode = BVH4::encodeTypedLeaf(encodeLeaf(range.u_start,range.v_start),0);

        /* return bounding box */
        const BBox3fa b0 = calculateBounds(time+0,range);
        const BBox3fa b1 = calculateBounds(time+1,range);
        return std::make_pair(curNode,LBBox3fa(b0,b1));
      }
      
      /* create internal node */
      else 
      {
        /* allocate new bvh4 node */
        BVH4::AABBNodeMB* node = (BVH4::AABBNodeMB *)&bvhData()[allocator];
        allocator += sizeof(BVH4::AABBNodeMB);
        node->clear();
        
        /* split range */
        GridRange r[4];
        const unsigned children = range.splitIntoSubRanges(r);
      
        /* recurse into subtrees */
        LBBox3fa bounds(empty);
        for (unsigned i=0; i<children; i++)
        {
          const BBox1f time_range(float(time+0)/float(time_steps-1),
                                  float(time+1)/float(time_steps-1));
          std::pair<BVH4::NodeRef,LBBox3fa> node_bounds = buildMBlurBVH(time, r[i], allocator);
          node->setRef(i,node_bounds.first);
          node->setBounds(i,node_bounds.second.global(time_range));
          bounds.extend(node_bounds.second);
        }
        assert(is_finite(bounds.bounds0));
        assert(is_finite(bounds.bounds1));
        
        return std::make_pair(BVH4::encodeNode(node),bounds);
      }
    }